

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

iterator * __thiscall Catch::clara::TextFlow::Columns::iterator::operator++(iterator *this)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  const_reference this_00;
  iterator local_48;
  ulong local_18;
  size_t i;
  iterator *this_local;
  
  i = (size_t)this;
  for (local_18 = 0; uVar1 = local_18,
      sVar3 = std::
              vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
              ::size(this->m_columns), uVar1 < sVar3; local_18 = local_18 + 1) {
    pvVar4 = std::
             vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
             ::operator[](&this->m_iterators,local_18);
    this_00 = std::
              vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
              ::operator[](this->m_columns,local_18);
    Column::end(&local_48,this_00);
    bVar2 = Column::iterator::operator!=(pvVar4,&local_48);
    if (bVar2) {
      pvVar4 = std::
               vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
               ::operator[](&this->m_iterators,local_18);
      Column::iterator::operator++(pvVar4);
    }
  }
  return this;
}

Assistant:

auto operator ++() -> iterator& {
			for (size_t i = 0; i < m_columns.size(); ++i) {
				if (m_iterators[i] != m_columns[i].end())
					++m_iterators[i];
			}
			return *this;
		}